

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O2

void __thiscall cfd::js::api::json::FundSelectUtxoData::FundSelectUtxoData(FundSelectUtxoData *this)

{
  _Rb_tree_header *p_Var1;
  allocator local_50;
  allocator local_4f;
  allocator local_4e;
  allocator local_4d;
  allocator local_4c;
  allocator local_4b;
  allocator local_4a;
  allocator local_49;
  string *local_48;
  string *local_40;
  string *local_38;
  
  (this->super_JsonClassBase<cfd::js::api::json::FundSelectUtxoData>)._vptr_JsonClassBase =
       (_func_int **)&PTR__FundSelectUtxoData_00b3ccb8;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string((string *)&this->txid_,"",&local_49);
  this->vout_ = 0;
  local_38 = &this->txid_;
  std::__cxx11::string::string((string *)&this->address_,"",&local_4a);
  this->amount_ = 0;
  local_40 = &this->address_;
  std::__cxx11::string::string((string *)&this->asset_,"",&local_4b);
  local_48 = &this->asset_;
  std::__cxx11::string::string((string *)&this->redeem_script_,"",&local_4c);
  std::__cxx11::string::string((string *)&this->descriptor_,"",&local_4d);
  this->is_issuance_ = false;
  this->is_blind_issuance_ = false;
  this->is_pegin_ = false;
  this->pegin_btc_tx_size_ = 0;
  this->pegin_tx_out_proof_size_ = 0;
  std::__cxx11::string::string((string *)&this->claim_script_,"",&local_4e);
  std::__cxx11::string::string((string *)&this->fedpeg_script_,"",&local_4f);
  std::__cxx11::string::string((string *)&this->script_sig_template_,"",&local_50);
  CollectFieldName();
  return;
}

Assistant:

FundSelectUtxoData() {
    CollectFieldName();
  }